

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O0

void __thiscall
blockencodings_tests::TransactionsRequestSerializationTest::test_method
          (TransactionsRequestSerializationTest *this)

{
  bool bVar1;
  reference pvVar2;
  long in_FS_OFFSET;
  DataStream stream;
  BlockTransactionsRequest req2;
  BlockTransactionsRequest req1;
  char *in_stack_fffffffffffffbd8;
  BlockTransactionsRequest *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  size_type in_stack_fffffffffffffbf0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffc08;
  const_string *in_stack_fffffffffffffc10;
  lazy_ostream *in_stack_fffffffffffffc18;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [64];
  undefined1 local_2a8 [16];
  undefined1 local_298 [64];
  undefined1 local_258 [16];
  undefined1 local_248 [64];
  undefined1 local_208 [16];
  undefined1 local_1f8 [64];
  BlockTransactionsRequest local_1b8;
  undefined1 local_158 [16];
  undefined1 local_148 [64];
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  BlockTransactionsRequest local_e0 [2];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  BlockTransactionsRequest::BlockTransactionsRequest
            ((BlockTransactionsRequest *)in_stack_fffffffffffffbd8);
  RandomMixin<FastRandomContext>::rand256(in_stack_fffffffffffffc08);
  local_38 = local_58;
  uStack_30 = uStack_50;
  local_48 = local_68;
  uStack_40 = uStack_60;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                      in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
  *pvVar2 = 0;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                      in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
  *pvVar2 = 1;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                      in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
  *pvVar2 = 3;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                      in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
  *pvVar2 = 4;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffbd8);
  DataStream::operator<<((DataStream *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  BlockTransactionsRequest::BlockTransactionsRequest
            ((BlockTransactionsRequest *)in_stack_fffffffffffffbd8);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               (size_t)in_stack_fffffffffffffc08,
               (const_string *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffbe0,(char (*) [1])in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffbe0);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe8 = "req2.blockhash.ToString()";
    in_stack_fffffffffffffbe0 = local_e0;
    in_stack_fffffffffffffbd8 = "req1.blockhash.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_148,local_158,0x174,1,2,&local_e0[0].indexes);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffbd8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               (size_t)in_stack_fffffffffffffc08,
               (const_string *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffbe0,(char (*) [1])in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    local_1b8.blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffbd8);
    local_1b8.blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffbd8);
    in_stack_fffffffffffffbe8 = "req2.indexes.size()";
    in_stack_fffffffffffffbe0 = &local_1b8;
    in_stack_fffffffffffffbd8 = "req1.indexes.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_1b8.indexes,local_1b8.blockhash.super_base_blob<256U>.m_data._M_elems + 0x10,
               0x175,1,2,local_1b8.blockhash.super_base_blob<256U>.m_data._M_elems + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffbd8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               (size_t)in_stack_fffffffffffffc08,
               (const_string *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffbe0,(char (*) [1])in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe0 =
         (BlockTransactionsRequest *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe8 = "req2.indexes[0]";
    in_stack_fffffffffffffbd8 = "req1.indexes[0]";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
              (local_1f8,local_208,0x176,1,2,pvVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffbd8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               (size_t)in_stack_fffffffffffffc08,
               (const_string *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffbe0,(char (*) [1])in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe0 =
         (BlockTransactionsRequest *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe8 = "req2.indexes[1]";
    in_stack_fffffffffffffbd8 = "req1.indexes[1]";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
              (local_248,local_258,0x177,1,2,pvVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffbd8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               (size_t)in_stack_fffffffffffffc08,
               (const_string *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffbe0,(char (*) [1])in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe0 =
         (BlockTransactionsRequest *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe8 = "req2.indexes[2]";
    in_stack_fffffffffffffbd8 = "req1.indexes[2]";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
              (local_298,local_2a8,0x178,1,2,pvVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffbd8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               (size_t)in_stack_fffffffffffffc08,
               (const_string *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    in_stack_fffffffffffffc18 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffbe0,(char (*) [1])in_stack_fffffffffffffbd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8,
               (pointer)in_stack_fffffffffffffbe0,(unsigned_long)in_stack_fffffffffffffbd8);
    in_stack_fffffffffffffc08 = (RandomMixin<FastRandomContext> *)0x3;
    in_stack_fffffffffffffc10 =
         (const_string *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe0 =
         (BlockTransactionsRequest *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe8 = "req2.indexes[3]";
    in_stack_fffffffffffffbd8 = "req1.indexes[3]";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
              (local_2e8,local_2f8,0x179,1,2,in_stack_fffffffffffffc10);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffbd8);
    in_stack_fffffffffffffc07 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc07);
  BlockTransactionsRequest::~BlockTransactionsRequest
            ((BlockTransactionsRequest *)in_stack_fffffffffffffbd8);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffbd8);
  BlockTransactionsRequest::~BlockTransactionsRequest
            ((BlockTransactionsRequest *)in_stack_fffffffffffffbd8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(TransactionsRequestSerializationTest) {
    BlockTransactionsRequest req1;
    req1.blockhash = m_rng.rand256();
    req1.indexes.resize(4);
    req1.indexes[0] = 0;
    req1.indexes[1] = 1;
    req1.indexes[2] = 3;
    req1.indexes[3] = 4;

    DataStream stream{};
    stream << req1;

    BlockTransactionsRequest req2;
    stream >> req2;

    BOOST_CHECK_EQUAL(req1.blockhash.ToString(), req2.blockhash.ToString());
    BOOST_CHECK_EQUAL(req1.indexes.size(), req2.indexes.size());
    BOOST_CHECK_EQUAL(req1.indexes[0], req2.indexes[0]);
    BOOST_CHECK_EQUAL(req1.indexes[1], req2.indexes[1]);
    BOOST_CHECK_EQUAL(req1.indexes[2], req2.indexes[2]);
    BOOST_CHECK_EQUAL(req1.indexes[3], req2.indexes[3]);
}